

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_unset_property(Integer g_a)

{
  long lVar1;
  short sVar2;
  uint dev_flag;
  cache_struct_t *pcVar3;
  Integer *pIVar4;
  bool bVar5;
  int iVar6;
  global_array_t *pgVar7;
  Integer IVar8;
  logical lVar9;
  C_Integer *pCVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  void *__ptr;
  int iVar14;
  cache_struct *pcVar15;
  ulong uVar16;
  Integer status;
  ulong local_108;
  Integer local_100;
  Integer local_f8;
  void *ptr;
  Integer hi [7];
  Integer lo [7];
  Integer ld [7];
  
  lVar1 = g_a + 1000;
  pgVar7 = GA + lVar1;
  if (GA[lVar1].property == 2) {
    pcVar3 = pgVar7->cache_head;
    if (pcVar3 != (cache_struct_t *)0x0) {
      __ptr = pcVar3->cache_buf;
      pcVar15 = pcVar3->next;
      while( true ) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        free(GA[lVar1].cache_head);
        if (pcVar15 == (cache_struct *)0x0) break;
        GA[lVar1].cache_head = pcVar15;
        pcVar15 = pcVar15->next;
        __ptr = (GA[lVar1].cache_head)->cache_buf;
      }
    }
    GA[lVar1].cache_head = (cache_struct_t *)0x0;
    return;
  }
  if (GA[lVar1].property != 1) {
    pgVar7->property = 0;
    return;
  }
  sVar2 = pgVar7->ndim;
  IVar8 = pnga_create_handle();
  local_108 = (long)sVar2;
  pnga_set_data(IVar8,(long)sVar2,GA[lVar1].dims,(long)GA[lVar1].type);
  pnga_set_pgroup(IVar8,(long)GA[lVar1].old_handle);
  lVar9 = pnga_allocate(IVar8);
  if (lVar9 == 0) {
    pnga_error("Failed to allocate temporary array",0);
  }
  local_100 = GAme;
  if (-1 < (long)GA[lVar1].old_handle) {
    local_100 = (long)PGRP_LIST[GA[lVar1].old_handle].map_proc_list[GAme];
  }
  local_f8 = IVar8;
  pnga_distribution(IVar8,local_100,lo,hi);
  uVar16 = local_108 & 0xffffffff;
  if ((short)local_108 < 1) {
LAB_0016ea4e:
    pnga_access_ptr(local_f8,lo,hi,&ptr,ld);
    pnga_get(g_a,lo,hi,ptr,ld);
  }
  else {
    bVar5 = true;
    uVar11 = 0;
    do {
      ld[uVar11] = (hi[uVar11] - lo[uVar11]) + 1;
      if (hi[uVar11] < lo[uVar11]) {
        bVar5 = false;
      }
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
    if (bVar5) goto LAB_0016ea4e;
  }
  lVar12 = (long)GA[lVar1].p_handle;
  if (lVar12 < 1) {
    lVar13 = GAme;
    if (-1 < GA[lVar1].p_handle) {
      lVar13 = (long)PGRP_LIST[lVar12].map_proc_list[GAme];
    }
    ARMCI_Free(GA[lVar1].ptr[lVar13] + -GA[lVar1].id);
  }
  else {
    ARMCI_Free_group(GA[lVar1].ptr[PGRP_LIST[lVar12].map_proc_list[GAme]] + -GA[lVar1].id,
                     &PGRP_LIST[lVar12].group);
  }
  pgVar7 = GA;
  if ((short)local_108 < 1) {
    iVar14 = 0;
  }
  else {
    uVar11 = 0;
    iVar14 = 0;
    do {
      pgVar7[g_a + 1000].nblock[uVar11] = pgVar7[g_a + 1000].old_nblock[uVar11];
      pgVar7[g_a + 1000].lo[uVar11] = (long)pgVar7[g_a + 1000].old_lo[uVar11];
      pgVar7[g_a + 1000].chunk[uVar11] = (long)pgVar7[g_a + 1000].old_chunk[uVar11];
      iVar14 = iVar14 + pgVar7[g_a + 1000].nblock[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
  }
  free(GA[lVar1].mapc);
  pCVar10 = (C_Integer *)malloc((long)iVar14 * 8 + 8);
  GA[lVar1].mapc = pCVar10;
  if (-1 < iVar14) {
    pCVar10 = GA[lVar1].mapc;
    pIVar4 = GA[lVar1].old_mapc;
    uVar11 = 0;
    do {
      pCVar10[uVar11] = pIVar4[uVar11];
      uVar11 = uVar11 + 1;
    } while (iVar14 + 1 != uVar11);
  }
  free(GA[lVar1].old_mapc);
  pnga_distribution(g_a,local_100,GA[lVar1].lo,hi);
  bVar5 = false;
  if ((short)local_108 < 1) {
    lVar12 = 1;
  }
  else {
    bVar5 = true;
    lVar12 = 1;
    uVar11 = 0;
    do {
      if (hi[uVar11] < GA[g_a + 1000].lo[uVar11]) {
        bVar5 = false;
      }
      lVar12 = lVar12 * ((hi[uVar11] - GA[g_a + 1000].lo[uVar11]) + 1);
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
    bVar5 = !bVar5;
  }
  lVar13 = 0;
  if (!bVar5) {
    lVar13 = GA[lVar1].elemsize * lVar12;
  }
  if (GA_memory_limited == '\x01') {
    lVar12 = GA[lVar1].size;
    GA_total_memory = (GA_total_memory + GA[lVar1].size) - lVar13;
  }
  else {
    lVar12 = GA[lVar1].size;
  }
  GAstat.curmem = GAstat.curmem - lVar12;
  if (GA_memory_limited == '\0') {
    status = 1;
  }
  else {
    status = (ulong)~GA_total_memory >> 0x3f;
    iVar14 = GA[lVar1].old_handle;
    IVar8 = pnga_type_f2c(0x3f2);
    pnga_pgroup_gop((long)iVar14,IVar8,&status,1,"&&");
  }
  pgVar7 = GA;
  iVar14 = GA[lVar1].p_handle;
  iVar6 = GA[lVar1].old_handle;
  GA[lVar1].p_handle = iVar6;
  if (status == 0) {
    pgVar7[lVar1].ptr[local_100] = (char *)0x0;
  }
  else {
    dev_flag = pgVar7[lVar1].mem_dev_set;
    if (dev_flag == 0) {
      iVar6 = gai_get_shmem(pgVar7[lVar1].ptr,lVar13,pgVar7[lVar1].type,&pgVar7[lVar1].id,iVar6);
    }
    else {
      iVar6 = gai_get_devmem((char *)(ulong)dev_flag,pgVar7[lVar1].ptr,lVar13,pgVar7[lVar1].type,
                             &pgVar7[lVar1].id,iVar6,dev_flag,pgVar7[lVar1].mem_dev);
    }
    status = (Integer)(iVar6 == 0);
  }
  GA[lVar1].size = lVar13;
  if (status == 0) {
    pnga_error("Memory failure when setting READ_ONLY",0);
  }
  pnga_pgroup_destroy((long)iVar14);
  GA[lVar1].property = 0;
  pnga_distribution(g_a,GAme,lo,hi);
  IVar8 = local_f8;
  if (0 < (short)local_108) {
    bVar5 = true;
    uVar11 = 0;
    do {
      ld[uVar11] = (hi[uVar11] - lo[uVar11]) + 1;
      if (hi[uVar11] < lo[uVar11]) {
        bVar5 = false;
      }
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
    if (!bVar5) goto LAB_0016ee6c;
  }
  pnga_access_ptr(g_a,lo,hi,&ptr,ld);
  pnga_get(IVar8,lo,hi,ptr,ld);
LAB_0016ee6c:
  pnga_destroy(IVar8);
  return;
}

Assistant:

void pnga_unset_property(Integer g_a) {
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].property == READ_ONLY) {
    /* TODO: Copy global array to original configuration */
    int i, d, ndim, btot, chk;
    Integer g_tmp, grp_me;
    Integer nprocs, nodeid, origin_id, dflt_grp, handle, maplen;
    Integer nelem, mem_size, status;
    Integer *list;
    Integer dims[MAXDIM], chunk[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM];
    void *ptr, *buf;

    ndim = (int)GA[ga_handle].ndim;
    /* Start by making a copy of the GA */
    for (i=0; i<ndim; i++) {
      chunk[i] = GA[ga_handle].chunk[i];
      dims[i] = GA[ga_handle].dims[i];
    }
    /* Make a temporary copy of GA */
    g_tmp = pnga_create_handle();
    pnga_set_data(g_tmp,ndim,GA[ga_handle].dims,GA[ga_handle].type);
    pnga_set_pgroup(g_tmp,GA[ga_handle].old_handle);
    if (!pnga_allocate(g_tmp)) {
      pnga_error("Failed to allocate temporary array",0);
    }
    /* Copy portion of global array to locally held portion of tmp array */
    grp_me = pnga_pgroup_nodeid(GA[ga_handle].old_handle);
    pnga_distribution(g_tmp,grp_me,lo,hi);
    chk = 1;
    for (i=0; i<ndim; i++) {
      ld[i] = hi[i]-lo[i]+1;
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
      pnga_access_ptr(g_tmp,lo,hi,&ptr,ld);
      pnga_get(g_a,lo,hi,ptr,ld);
    }

    /* Get rid of current memory allocation */
#ifndef AVOID_MA_STORAGE
    if(gai_uses_shm((int)GA[ga_handle].p_handle)){
#endif
      /* make sure that we free original (before address allignment)
       * pointer */
#ifdef MSG_COMMS_MPI
      if (GA[ga_handle].p_handle > 0){
        ARMCI_Free_group(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].p_handle)]
            - GA[ga_handle].id,
            &PGRP_LIST[GA[ga_handle].p_handle].group);
      }
      else
#endif
      {
        ARMCI_Free(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].p_handle)]
            - GA[ga_handle].id);
      }
#ifndef AVOID_MA_STORAGE
    }else{
      if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
    }
#endif
    
    /* Reset distribution parameters back to original values */
    btot = 0;
    for (i=0; i<ndim; i++) {
      GA[ga_handle].nblock[i] = GA[ga_handle].old_nblock[i];
      GA[ga_handle].lo[i] = GA[ga_handle].old_lo[i];
      GA[ga_handle].chunk[i] = GA[ga_handle].old_chunk[i];
      btot += GA[ga_handle].nblock[i];
    }
    free(GA[ga_handle].mapc);
    GA[ga_handle].mapc = (Integer*)malloc((btot+1)*sizeof(Integer));
    for (i=0; i<btot+1; i++) {
      GA[ga_handle].mapc[i] = GA[ga_handle].old_mapc[i];
    }
    free(GA[ga_handle].old_mapc);

    pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    chk = 1;
    for( i = 0, nelem=1; i< ndim; i++){
      if (hi[i]-(Integer)GA[ga_handle].lo[i]+1 <= 0) chk = 0;
      nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1);
    }
    mem_size = nelem * GA[ga_handle].elemsize;
    if (!chk) mem_size = 0;

    if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
    GAstat.curmem -= GA[ga_handle].size;
    /* if requested, enforce limits on memory consumption */
    if(GA_memory_limited) GA_total_memory -= mem_size;
    /* check if everybody has enough memory left */
    if(GA_memory_limited){
      status = (GA_total_memory >= 0) ? 1 : 0;
      pnga_pgroup_gop(GA[ga_handle].old_handle,pnga_type_f2c(MT_F_INT),
          &status, 1, "&&");
    } else status = 1;
    handle = (Integer)GA[ga_handle].p_handle;
    GA[ga_handle].p_handle = GA[ga_handle].old_handle;
    if (status) {
      /* Allocate new memory */
      if (GA[ga_handle].mem_dev_set) {
        status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, GA[ga_handle].p_handle,
            GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
      } else {
        status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, GA[ga_handle].p_handle);
      }
    } else {
      GA[ga_handle].ptr[grp_me]=NULL;
    }
    GA[ga_handle].size = (C_Long)mem_size;
    if (!status) {
      pnga_error("Memory failure when setting READ_ONLY",0);
    }
    /* Get rid of read-only group */
    pnga_pgroup_destroy(handle);
    /* Generate parameters for new memory allocation. Distribution function
     * should work, so we can use that to find out how much data is on this
     * processor */
    GA[ga_handle].property = NO_PROPERTY;
    pnga_distribution(g_a,GAme,lo,hi);
    chk = 1;
    nelem = 1;
    for (i=0; i<ndim; i++) {
      ld[i] = hi[i]-lo[i]+1;
      nelem *= ld[i];
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
#if 1
      pnga_access_ptr(g_a,lo,hi,&ptr,ld);
      pnga_get(g_tmp,lo,hi,ptr,ld);
#else
      /* MPI RMA does not allow you to use memory assigned to one window as
       * local buffer for another buffer. Create a local buffer to get around
       * this problem */
      buf = (void*)malloc(nelem*GA[ga_handle].elemsize);
      pnga_get(g_tmp,lo,hi,buf,ld);
      pnga_access_ptr(g_a,lo,hi,&ptr,ld);
      memcpy(ptr,buf,nelem*GA[ga_handle].elemsize);
      free(buf);
#endif
    }
    pnga_destroy(g_tmp);
  } else if (GA[ga_handle].property == READ_CACHE) {
    if (GA[ga_handle].cache_head != NULL) {
      cache_struct_t *next;
      next = GA[ga_handle].cache_head->next;
      if (GA[ga_handle].cache_head->cache_buf)
        free(GA[ga_handle].cache_head->cache_buf);
      free(GA[ga_handle].cache_head);
      while (next) {
        GA[ga_handle].cache_head = next;
        next = next->next;
        if (GA[ga_handle].cache_head->cache_buf)
          free(GA[ga_handle].cache_head->cache_buf);
        free(GA[ga_handle].cache_head);
      }
    }
    GA[ga_handle].cache_head = NULL;
  } else {
    GA[ga_handle].property = NO_PROPERTY;
  }
}